

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

void __thiscall amrex::MultiFab::WeightedSync(MultiFab *this,MultiFab *wgt,Periodicity *period)

{
  int iVar1;
  FabArray<amrex::FArrayBox> *this_00;
  FabFactory<amrex::FArrayBox> *val;
  FabArrayBase *in_RDI;
  MultiFab tmpmf;
  int comp;
  int ncomp;
  FabArrayBase *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffe08;
  undefined1 *puVar2;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffe20;
  BoxArray *bxs;
  MultiFab *this_01;
  FabFactory<amrex::FArrayBox> *factory;
  int local_2c;
  uint local_24 [7];
  uint *local_8;
  
  local_24[0] = (uint)FabArrayBase::ixType(in_stack_fffffffffffffde8);
  local_8 = local_24;
  if (local_24[0] != 0) {
    iVar1 = FabArrayBase::nComp(in_RDI);
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      Multiply((MultiFab *)in_stack_fffffffffffffe20,
               (MultiFab *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08);
    }
    this_00 = (FabArray<amrex::FArrayBox> *)FabArrayBase::boxArray(in_RDI);
    FabArrayBase::DistributionMap(in_RDI);
    factory = (FabFactory<amrex::FArrayBox> *)0x0;
    bxs = (BoxArray *)0x0;
    this_01 = (MultiFab *)0x0;
    puVar2 = &stack0xfffffffffffffe28;
    MFInfo::MFInfo((MFInfo *)0x128ba7c);
    val = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x128ba86);
    MultiFab(this_01,bxs,(DistributionMapping *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
             in_stack_fffffffffffffe18,(MFInfo *)in_RDI,factory);
    MFInfo::~MFInfo((MFInfo *)0x128babb);
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(this_00,(value_type)val);
    FabArray<amrex::FArrayBox>::ParallelCopy
              (in_stack_fffffffffffffe20,
               (FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),(Periodicity *)in_RDI,
               (CpOp)((ulong)puVar2 >> 0x20));
    Copy((MultiFab *)in_stack_fffffffffffffe20,
         (MultiFab *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
         (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)puVar2 >> 0x20),(int)puVar2);
    ~MultiFab((MultiFab *)0x128bb14);
  }
  return;
}

Assistant:

void
MultiFab::WeightedSync (const MultiFab& wgt, const Periodicity& period)
{
    BL_PROFILE("MultiFab::WeightedSync()");

    if (ixType().cellCentered()) return;

    const int ncomp = nComp();
    for (int comp = 0; comp < ncomp; ++comp)
    {
        MultiFab::Multiply(*this, wgt, 0, comp, 1, 0);
    }

    MultiFab tmpmf(boxArray(), DistributionMap(), ncomp, 0, MFInfo(), Factory());
    tmpmf.setVal(Real(0.0));
    tmpmf.ParallelCopy(*this, period, FabArrayBase::ADD);

    MultiFab::Copy(*this, tmpmf, 0, 0, ncomp, 0);
}